

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.h
# Opt level: O1

bool __thiscall mkvmuxer::Segment::CuesTrack(Segment *this,uint64_t track_number)

{
  long lVar1;
  long lVar2;
  Track *pTVar3;
  bool bVar4;
  
  lVar1 = (long)(int)(this->tracks_).track_entries_size_;
  if (lVar1 < 1) {
    bVar4 = false;
  }
  else {
    lVar2 = 0;
    do {
      pTVar3 = (this->tracks_).track_entries_[lVar2];
      if (pTVar3->number_ == track_number) goto LAB_001568d6;
      lVar2 = lVar2 + 1;
    } while (lVar1 != lVar2);
    pTVar3 = (Track *)0x0;
LAB_001568d6:
    bVar4 = pTVar3 != (Track *)0x0;
  }
  if (bVar4 != false) {
    this->cues_track_ = track_number;
  }
  return bVar4;
}

Assistant:

uint32_t track_entries_size() const { return track_entries_size_; }